

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O3

void bhf::ads::ParseStringData(RegistryEntry *value,char **it,istream *param_3,size_t *lineNumber)

{
  char *pcVar1;
  stringstream sVar2;
  runtime_error *this;
  ostream *poVar3;
  stringstream *psVar4;
  stringstream ss;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  psVar4 = (stringstream *)*it;
  sVar2 = *psVar4;
  if (sVar2 != (stringstream)0x0) {
    do {
      if (psVar4[1] == (stringstream)0x0) {
        if (sVar2 == (stringstream)0x22) {
          local_1b0[0] = (stringstream)0x0;
          RegistryEntry::Append(value,local_1b0,1);
          value->dataLen = value->dataLen + 1;
          return;
        }
        break;
      }
      local_1b0[0] = sVar2;
      RegistryEntry::Append(value,local_1b0,1);
      value->dataLen = value->dataLen + 1;
      pcVar1 = *it;
      psVar4 = (stringstream *)(pcVar1 + 1);
      *it = (char *)psVar4;
      sVar2 = *(stringstream *)(pcVar1 + 1);
    } while (sVar2 != (stringstream)0x0);
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (*lineNumber == 0xffffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Invalid network data: ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"missing closing quotation mark",0x1e);
    local_1d0[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_1d0,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Invalid file format: ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"missing closing quotation mark",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," in line ",9);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    local_1d0[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1d0,1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void ParseStringData(RegistryEntry& value, const char*& it, std::istream& /*input*/, size_t& lineNumber)
{
    // REG_SZ data should end with a closing quote and null terminator
    while ('\0' != it[0] && '\0' != it[1]) {
        value.PushData(*it);
        ++it;
    }
    if ('\"' != *it) {
        PARSING_EXCEPTION("missing closing quotation mark");
    }
    value.PushData('\0');
}